

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lb.cpp
# Opt level: O0

void __thiscall zmq::lb_t::~lb_t(lb_t *this)

{
  bool bVar1;
  
  bVar1 = array_t<zmq::pipe_t,_2>::empty((array_t<zmq::pipe_t,_2> *)0x2f832d);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_pipes.empty ()",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/lb.cpp"
            ,0x2a);
    fflush(_stderr);
    zmq_abort((char *)0x2f838b);
  }
  array_t<zmq::pipe_t,_2>::~array_t((array_t<zmq::pipe_t,_2> *)0x2f839d);
  return;
}

Assistant:

zmq::lb_t::~lb_t ()
{
    zmq_assert (_pipes.empty ());
}